

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_overflow_strings_to_disk.cpp
# Opt level: O3

void __thiscall
duckdb::WriteOverflowStringsToDisk::WriteString
          (WriteOverflowStringsToDisk *this,UncompressedStringSegmentState *state,string_t string,
          block_id_t *result_block,int32_t *result_offset)

{
  BufferManager *pBVar1;
  data_ptr_t pdVar2;
  bool bVar3;
  int iVar4;
  BlockManager *pBVar5;
  idx_t iVar6;
  undefined4 extraout_var;
  idx_t iVar7;
  undefined4 extraout_var_00;
  ulong uVar8;
  void *__src;
  uint uVar9;
  size_t __n;
  undefined8 local_58;
  void *local_50;
  BufferHandle local_48;
  
  uVar8 = string.value._0_8_;
  local_58 = uVar8;
  local_50 = string.value._8_8_;
  pBVar5 = PartialBlockManager::GetBlockManager(this->partial_block_manager);
  pBVar1 = pBVar5->buffer_manager;
  bVar3 = BufferHandle::IsValid(&this->handle);
  if (!bVar3) {
    (*pBVar1->_vptr_BufferManager[5])(&local_48,pBVar1,8,pBVar5,1);
    BufferHandle::operator=(&this->handle,&local_48);
    BufferHandle::~BufferHandle(&local_48);
  }
  if ((this->block_id == -1) ||
     (iVar7 = this->offset, iVar6 = GetStringSpace(this), iVar6 <= iVar7 + 8)) {
    iVar4 = (*pBVar5->_vptr_BlockManager[4])(pBVar5);
    AllocateNewBlock(this,state,CONCAT44(extraout_var,iVar4));
  }
  *result_block = this->block_id;
  *result_offset = (int32_t)this->offset;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->handle).node);
  pdVar2 = ((this->handle).node.ptr)->buffer;
  uVar9 = string.value._0_4_;
  *(uint *)(pdVar2 + this->offset) = uVar9;
  this->offset = this->offset + 4;
  if (uVar9 == 0) {
    return;
  }
  __src = string.value._8_8_;
  if (uVar9 < 0xd) {
    __src = (void *)((long)&local_58 + 4);
  }
  do {
    iVar7 = GetStringSpace(this);
    uVar9 = (int)iVar7 - (int)this->offset;
    if (uVar9 != 0) {
      __n = (size_t)uVar9;
      if ((uint)uVar8 < uVar9) {
        __n = uVar8 & 0xffffffff;
      }
      switchD_015df945::default(pdVar2 + this->offset,__src,__n);
      this->offset = this->offset + __n;
      uVar9 = (uint)uVar8 - (int)__n;
      uVar8 = (ulong)uVar9;
      if (uVar9 == 0) {
        return;
      }
      __src = (void *)((long)__src + __n);
    }
    iVar4 = (*pBVar5->_vptr_BlockManager[4])(pBVar5);
    AllocateNewBlock(this,state,CONCAT44(extraout_var_00,iVar4));
  } while( true );
}

Assistant:

void WriteOverflowStringsToDisk::WriteString(UncompressedStringSegmentState &state, string_t string,
                                             block_id_t &result_block, int32_t &result_offset) {
	auto &block_manager = partial_block_manager.GetBlockManager();
	auto &buffer_manager = block_manager.buffer_manager;
	if (!handle.IsValid()) {
		handle = buffer_manager.Allocate(MemoryTag::OVERFLOW_STRINGS, &block_manager);
	}
	// first write the length of the string
	if (block_id == INVALID_BLOCK || offset + 2 * sizeof(uint32_t) >= GetStringSpace()) {
		AllocateNewBlock(state, block_manager.GetFreeBlockId());
	}
	result_block = block_id;
	result_offset = UnsafeNumericCast<int32_t>(offset);

	// write the length field
	auto data_ptr = handle.Ptr();
	auto string_length = string.GetSize();
	Store<uint32_t>(UnsafeNumericCast<uint32_t>(string_length), data_ptr + offset);
	offset += sizeof(uint32_t);

	// now write the remainder of the string
	auto strptr = string.GetData();
	auto remaining = UnsafeNumericCast<uint32_t>(string_length);
	while (remaining > 0) {
		uint32_t to_write = MinValue<uint32_t>(remaining, UnsafeNumericCast<uint32_t>(GetStringSpace() - offset));
		if (to_write > 0) {
			memcpy(data_ptr + offset, strptr, to_write);

			remaining -= to_write;
			offset += to_write;
			strptr += to_write;
		}
		if (remaining > 0) {
			D_ASSERT(offset == GetStringSpace());
			// there is still remaining stuff to write
			// now write the current block to disk and allocate a new block
			AllocateNewBlock(state, block_manager.GetFreeBlockId());
		}
	}
}